

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int newlabelentry(LexState *ls,Labellist *l,TString *name,int line,int pc)

{
  int iVar1;
  Labeldesc *pLVar2;
  int n;
  int pc_local;
  int line_local;
  TString *name_local;
  Labellist *l_local;
  LexState *ls_local;
  
  iVar1 = l->n;
  if (l->size < iVar1 + 1) {
    pLVar2 = (Labeldesc *)luaM_growaux_(ls->L,l->arr,&l->size,0x18,0x7fff,"labels/gotos");
    l->arr = pLVar2;
  }
  l->arr[iVar1].name = name;
  l->arr[iVar1].line = line;
  l->arr[iVar1].nactvar = ls->fs->nactvar;
  l->arr[iVar1].pc = pc;
  l->n = iVar1 + 1;
  return iVar1;
}

Assistant:

static int newlabelentry (LexState *ls, Labellist *l, TString *name,
                          int line, int pc) {
  int n = l->n;
  luaM_growvector(ls->L, l->arr, n, l->size,
                  Labeldesc, SHRT_MAX, "labels/gotos");
  l->arr[n].name = name;
  l->arr[n].line = line;
  l->arr[n].nactvar = ls->fs->nactvar;
  l->arr[n].pc = pc;
  l->n = n + 1;
  return n;
}